

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O1

void __thiscall SymbolTable::cInsert(SymbolTable *this,Symbol *symbol,char *lexeme)

{
  int iVar1;
  Symbol **ppSVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  string *__range1;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  if (lexeme != (char *)0x0) {
    local_48 = local_38;
    sVar3 = strlen(lexeme);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,lexeme,lexeme + sVar3);
    if (local_40 == 0) {
      uVar7 = 0;
    }
    else {
      lVar5 = 1;
      lVar6 = 0;
      uVar7 = 0;
      do {
        uVar7 = (uVar7 + ((long)(char)local_48[lVar6] + -0x60) * lVar5) % 0x3b9aca09;
        lVar5 = (lVar5 * 0xad) % 0x3b9aca09;
        lVar6 = lVar6 + 1;
      } while (local_40 != lVar6);
      uVar7 = uVar7 % 0x65;
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    ppSVar2 = this->block;
    symbol->nextSymbol = ppSVar2[uVar7];
    ppSVar2[uVar7] = symbol;
    iVar1 = this->headIndex;
    sVar3 = strlen(lexeme);
    if ((ulong)(uint)this->lexemeArraySize <= sVar3 + (long)iVar1) {
      uVar8 = this->lexemeArraySize;
      while( true ) {
        sVar3 = strlen(lexeme);
        if (sVar3 + (long)iVar1 < (ulong)uVar8) break;
        uVar8 = uVar8 + 0x1000;
        this->lexemeArraySize = uVar8;
      }
      pcVar4 = (char *)realloc(this->lexemeArray,(long)(int)uVar8);
      this->lexemeArray = pcVar4;
    }
    strcpy(this->lexemeArray + this->headIndex,lexeme);
    iVar1 = this->headIndex;
    symbol->lexemeIndex = iVar1;
    sVar3 = strlen(lexeme);
    this->headIndex = (int)sVar3 + iVar1 + 1;
  }
  return;
}

Assistant:

void SymbolTable::cInsert(Symbol *symbol, const char *lexeme) {
    if (lexeme != NULL) {
        unsigned long index = cHash(lexeme);
        symbol->setNextSymbol(block[index]);
        block[index] = symbol;
        if (headIndex + strlen(lexeme) >= (unsigned) lexemeArraySize) {
            while (headIndex + strlen(lexeme) >= (unsigned) lexemeArraySize)
                lexemeArraySize += LEXEME_ARRAY_SIZE;
//            lexemeArraySize += (1 + strlen(lexeme)/LEXEME_ARRAY_SIZE)*LEXEME_ARRAY_SIZE;
            lexemeArray = (char *) realloc(lexemeArray, lexemeArraySize * sizeof(char));
        }
        strcpy(lexemeArray + headIndex, lexeme);
        symbol->setLexemeIndex(headIndex);
        headIndex += (int) strlen(lexeme) + 1;
    }
}